

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O2

int convert_options(int sz_opts)

{
  int i;
  uint uVar1;
  uint uVar2;
  int co [129];
  
  uVar2 = 0;
  memset(co,0,0x204);
  co[0x10] = 4;
  co[0x20] = 8;
  for (uVar1 = 1; (int)uVar1 < 0x81; uVar1 = uVar1 * 2) {
    if ((uVar1 & sz_opts) != 0) {
      uVar2 = uVar2 | co[(int)uVar1];
    }
  }
  return uVar2;
}

Assistant:

static int convert_options(int sz_opts)
{
    int co[NOPTS];
    int opts = 0;

    memset(co, 0, sizeof(int) * NOPTS);
    co[SZ_MSB_OPTION_MASK] = AEC_DATA_MSB;
    co[SZ_NN_OPTION_MASK] = AEC_DATA_PREPROCESS;

    for (int i = 1; i < NOPTS; i <<= 1)
        if (sz_opts & i)
            opts |= co[i];

    return opts;
}